

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

void immutable::rrb_details::release<char>(internal_node<char,_false> *p_node)

{
  uint32_t uVar1;
  internal_node<char,_false> *piVar2;
  internal_node<char,_false> *p_node_00;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  
  if ((p_node == (internal_node<char,_false> *)0x0) ||
     (uVar1 = p_node->_ref_count, p_node->_ref_count = uVar1 - 1, uVar1 != 1)) {
    return;
  }
  ref<immutable::rrb_details::rrb_size_table<false>_>::dec(&p_node->size_table);
  lVar3 = 0;
  uVar4 = 0;
  do {
    if (p_node->len <= uVar4) {
      free(p_node);
      return;
    }
    if (*(long *)((long)&p_node->child->ptr + lVar3) == 0) {
      p_node_00 = (internal_node<char,_false> *)0x0;
LAB_0013e6ae:
      release<char>(p_node_00);
    }
    else {
      piVar2 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                          ((long)&p_node->child->ptr + lVar3));
      p_node_00 = *(internal_node<char,_false> **)((long)&p_node->child->ptr + lVar3);
      if (piVar2->type != LEAF_NODE) goto LAB_0013e6ae;
      release<char>((leaf_node<char,_false> *)p_node_00);
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 8;
  } while( true );
}

Assistant:

inline void release(const internal_node<T, false>* p_node)
      {
      if (p_node)
        {
        if (1 == p_node->_ref_count--)
          {
          p_node->size_table.dec();
          for (uint32_t i = 0; i < p_node->len; ++i)
            {
            if (p_node->child[i].ptr && p_node->child[i]->type == LEAF_NODE)
              {
              release((leaf_node<T, false>*)p_node->child[i].ptr);
              }
            else
              release(p_node->child[i].ptr);
            }
          free((void*)p_node);
          }
        }
      }